

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

void hputc(char *hstring,char *keyword,char *value)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *in_RDX;
  char *in_RSI;
  bool bVar8;
  int i;
  int lc;
  int lval;
  int lcom;
  int lkeyword;
  char *ve;
  char *c1;
  char *q2;
  char *q1;
  char *v2;
  char *v1;
  char *vp;
  char *v;
  char blank [80];
  char newcom [50];
  char line [100];
  char squot;
  int local_16c;
  int local_168;
  int local_160;
  char *local_148;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *local_120;
  char acStack_118 [144];
  char local_88 [80];
  undefined1 local_38;
  char local_19;
  char *local_18;
  char *local_10;
  
  local_19 = '\'';
  for (local_16c = 0; local_16c < 0x50; local_16c = local_16c + 1) {
    acStack_118[local_16c] = ' ';
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = strlen(in_RSI);
  sVar3 = strlen(local_18);
  local_168 = (int)sVar3;
  if (((int)sVar2 == 7) &&
     ((iVar1 = strncmp(local_10,"COMMENT",7), iVar1 == 0 ||
      (iVar1 = strncmp(local_10,"HISTORY",7), iVar1 == 0)))) {
    pcVar4 = ksearch(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    pcVar5 = pcVar4 + 0x50;
    strncpy(pcVar5,pcVar4,0x50);
    strncpy(pcVar4,local_10,7);
    for (pcVar6 = pcVar4 + 7; pcVar6 < pcVar5; pcVar6 = pcVar6 + 1) {
      *pcVar6 = ' ';
    }
    strncpy(pcVar4 + 9,local_18,(long)local_168);
  }
  else {
    pcVar4 = ksearch(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = blsearch(in_stack_fffffffffffffed8,(char *)0x0);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = ksearch((char *)0x0,in_stack_fffffffffffffec8);
        pcVar5 = pcVar4 + 0x50;
        strncpy(pcVar5,pcVar4,0x50);
      }
      else {
        pcVar5 = pcVar4 + 0x50;
      }
      local_160 = 0;
      acStack_118[0x50] = 0;
      local_120 = pcVar4;
    }
    else {
      strncpy(local_88,pcVar4,0x50);
      local_38 = 0;
      pcVar5 = pcVar4 + 0x50;
      pcVar6 = strchr(local_88,(int)local_19);
      if (pcVar6 == (char *)0x0) {
        local_148 = local_88;
      }
      else {
        local_148 = strchr(pcVar6 + 1,(int)local_19);
      }
      pcVar6 = strchr(local_148,0x2f);
      if (pcVar6 == (char *)0x0) {
        acStack_118[0x50] = 0;
        local_160 = 0;
        local_120 = pcVar4;
      }
      else {
        iVar1 = 0x50 - ((int)pcVar6 - (int)local_88);
        strncpy(acStack_118 + 0x50,pcVar6 + 1,(long)iVar1);
        pcVar6 = acStack_118 + (long)iVar1 + 0x4f;
        while( true ) {
          pcVar7 = pcVar6 + -1;
          bVar8 = false;
          if (acStack_118 + 0x50 < pcVar6) {
            bVar8 = *pcVar7 == ' ';
          }
          if (!bVar8) break;
          *pcVar7 = '\0';
          pcVar6 = pcVar7;
        }
        sVar3 = strlen(acStack_118 + 0x50);
        local_160 = (int)sVar3;
        local_120 = pcVar4;
      }
    }
    for (; pcVar4 < pcVar5; pcVar4 = pcVar4 + 1) {
      *pcVar4 = ' ';
    }
    strncpy(local_120,local_10,(long)(int)sVar2);
    local_120[8] = '=';
    local_120[9] = ' ';
    if (*local_18 == local_19) {
      strncpy(local_120 + 10,local_18,(long)local_168);
      if (local_168 + 0xc < 0x20) {
        local_168 = 0x1e;
      }
      else {
        local_168 = local_168 + 0xc;
      }
    }
    else {
      strncpy(local_120 + (0x1e - (long)local_168),local_18,(long)local_168);
      local_168 = 0x1e;
    }
    if (0 < local_160) {
      if (0x50 < local_168 + 2 + local_160) {
        local_160 = 0x4e - local_168;
      }
      local_120[(long)local_168 + 2] = '/';
      local_120 = local_120 + (long)local_168 + 3;
      strncpy(local_120,acStack_118 + 0x50,(long)local_160);
      for (local_120 = local_120 + local_160; local_120 < pcVar5; local_120 = local_120 + 1) {
        *local_120 = ' ';
      }
    }
  }
  return;
}

Assistant:

static void
hputc (hstring,keyword,value)

char *hstring;
char *keyword;
char *value;	/* character string containing the value for variable
		   keyword.  trailing and leading blanks are removed.  */
{
    char squot = 39;
    char line[100];
    char newcom[50];
    char blank[80];
    char *v, *vp, *v1, *v2, *q1, *q2, *c1, *ve;
    int lkeyword, lcom, lval, lc, i;

    for (i = 0; i < 80; i++)
	blank[i] = ' ';

    /*  find length of keyword and value */
    lkeyword = strlen (keyword);
    lval = strlen (value);

    /*  If COMMENT or HISTORY, always add it just before the END */
    if (lkeyword == 7 && (strncmp (keyword,"COMMENT",7) == 0 ||
	strncmp (keyword,"HISTORY",7) == 0)) {

	/* Find end of header */
	v1 = ksearch (hstring,"END");
	v2 = v1 + 80;

	/* Move END down one line */
	strncpy (v2, v1, 80);

	/* Insert keyword */
	strncpy (v1,keyword,7);

	/* Pad with spaces */
	for (vp = v1+lkeyword; vp < v2; vp++)
	    *vp = ' ';

	/* Insert comment */
	strncpy (v1+9,value,lval);
	return;
	}

    /* Otherwise search for keyword */
    else
	v1 = ksearch (hstring,keyword);

    /*  If parameter is not found, find a place to put it */
    if (v1 == NULL) {
	
	/* First look for blank lines before END */
        v1 = blsearch (hstring, "END");
    
	/*  Otherwise, create a space for it at the end of the header */
	if (v1 == NULL) {
	    ve = ksearch (hstring,"END");
	    v1 = ve;
	    v2 = v1 + 80;
	    strncpy (v2, ve, 80);
	    }
	else
	    v2 = v1 + 80;
	lcom = 0;
	newcom[0] = 0;
	}

    /*  Otherwise, extract the entry for this keyword from the header */
    else {
	strncpy (line, v1, 80);
	line[80] = 0;
	v2 = v1 + 80;

	/*  check for quoted value */
	q1 = strchr (line, squot);
	if (q1 != NULL)
	    q2 = strchr (q1+1,squot);
	else
	    q2 = line;

	/*  extract comment and remove trailing spaces */

	c1 = strchr (q2,'/');
	if (c1 != NULL) {
	    lcom = 80 - (c1 - line);
	    strncpy (newcom, c1+1, lcom);
	    vp = newcom + lcom - 1;
	    while (vp-- > newcom && *vp == ' ')
		*vp = 0;
	    lcom = strlen (newcom);
	    }
	else {
	    newcom[0] = 0;
	    lcom = 0;
	    }
	}

    /* Fill new entry with spaces */
    for (vp = v1; vp < v2; vp++)
	*vp = ' ';

    /*  Copy keyword to new entry */
    strncpy (v1, keyword, lkeyword);

    /*  Add parameter value in the appropriate place */
    vp = v1 + 8;
    *vp = '=';
    vp = v1 + 9;
    *vp = ' ';
    vp = vp + 1;
    if (*value == squot) {
	strncpy (vp, value, lval);
	if (lval+12 > 31)
	    lc = lval + 12;
	else
	    lc = 30;
	}
    else {
	vp = v1 + 30 - lval;
	strncpy (vp, value, lval);
	lc = 30;
	}

    /* Add comment in the appropriate place */
	if (lcom > 0) {
	    if (lc+2+lcom > 80)
		lcom = 78 - lc;
	    vp = v1 + lc + 2;     /* Jul 16 1997: was vp = v1 + lc * 2 */
	    *vp = '/';
	    vp = vp + 1;
	    strncpy (vp, newcom, lcom);
	    for (v = vp + lcom; v < v2; v++)
		*v = ' ';
	    }

	return;
}